

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

void hts_idx_finish(hts_idx_t *idx,uint64_t final_offset)

{
  bins_t *pbVar1;
  uint64_t *puVar2;
  kh_bin_t *pkVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  bidx_t *pbVar6;
  bool bVar7;
  ulong uVar8;
  khint_t kVar9;
  long lVar10;
  hts_pair64_t *phVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  bins_t *pbVar26;
  int absent;
  int absent_1;
  int absent_2;
  int local_3c;
  int local_38;
  int local_34;
  
  if ((idx == (hts_idx_t *)0x0) || ((idx->z).finished != 0)) {
    return;
  }
  lVar10 = (long)(idx->z).save_tid;
  if (-1 < lVar10) {
    pkVar3 = idx->bidx[lVar10];
    uVar4 = (idx->z).save_off;
    kVar9 = kh_put_bin(pkVar3,(idx->z).save_bin,&local_3c);
    pbVar26 = pkVar3->vals + kVar9;
    if (local_3c != 0) {
      pbVar26->m = 1;
      pbVar26->n = 0;
      phVar11 = (hts_pair64_t *)calloc(1,0x10);
      pbVar26->list = phVar11;
    }
    if (pbVar26->n == pbVar26->m) {
      iVar21 = pbVar26->m * 2;
      pbVar26->m = iVar21;
      phVar11 = (hts_pair64_t *)realloc(pbVar26->list,(long)iVar21 << 4);
      pbVar26->list = phVar11;
    }
    phVar11 = pbVar26->list;
    iVar21 = pbVar26->n;
    phVar11[iVar21].u = uVar4;
    pbVar26->n = iVar21 + 1;
    phVar11[iVar21].v = final_offset;
    pkVar3 = idx->bidx[(idx->z).save_tid];
    uVar4 = (idx->z).off_beg;
    kVar9 = kh_put_bin(pkVar3,idx->n_bins + 1,&local_38);
    pbVar26 = pkVar3->vals + kVar9;
    if (local_38 != 0) {
      pbVar26->m = 1;
      pbVar26->n = 0;
      phVar11 = (hts_pair64_t *)calloc(1,0x10);
      pbVar26->list = phVar11;
    }
    if (pbVar26->n == pbVar26->m) {
      iVar21 = pbVar26->m * 2;
      pbVar26->m = iVar21;
      phVar11 = (hts_pair64_t *)realloc(pbVar26->list,(long)iVar21 << 4);
      pbVar26->list = phVar11;
    }
    phVar11 = pbVar26->list;
    iVar21 = pbVar26->n;
    phVar11[iVar21].u = uVar4;
    pbVar26->n = iVar21 + 1;
    phVar11[iVar21].v = final_offset;
    pkVar3 = idx->bidx[(idx->z).save_tid];
    uVar4 = (idx->z).n_mapped;
    uVar5 = (idx->z).n_unmapped;
    kVar9 = kh_put_bin(pkVar3,idx->n_bins + 1,&local_34);
    pbVar26 = pkVar3->vals + kVar9;
    if (local_34 != 0) {
      pbVar26->m = 1;
      pbVar26->n = 0;
      phVar11 = (hts_pair64_t *)calloc(1,0x10);
      pbVar26->list = phVar11;
    }
    if (pbVar26->n == pbVar26->m) {
      iVar21 = pbVar26->m * 2;
      pbVar26->m = iVar21;
      phVar11 = (hts_pair64_t *)realloc(pbVar26->list,(long)iVar21 << 4);
      pbVar26->list = phVar11;
    }
    phVar11 = pbVar26->list;
    iVar21 = pbVar26->n;
    phVar11[iVar21].u = uVar4;
    pbVar26->n = iVar21 + 1;
    phVar11[iVar21].v = uVar5;
  }
  if (0 < idx->n) {
    lVar10 = 0;
    do {
      update_loff(idx,(int)lVar10,(uint)(idx->fmt == 0));
      pbVar6 = idx->bidx[lVar10];
      if (pbVar6 != (bidx_t *)0x0) {
        iVar21 = idx->n_lvls;
        if (0 < idx->n_lvls) {
          do {
            if (pbVar6->n_buckets != 0) {
              uVar14 = 0;
              do {
                kVar9 = (khint_t)uVar14;
                uVar15 = kVar9 * 2 & 0x1e;
                uVar25 = 3 << (sbyte)uVar15;
                uVar8 = uVar14 >> 4;
                if ((((pbVar6->flags[uVar8] & uVar25) == 0) &&
                    (pbVar6->keys[uVar14] < (uint)idx->n_bins)) &&
                   ((uint)((ulong)(uint)~(-1 << ((char)iVar21 * '\x03' & 0x1fU)) * 0x92492493 >>
                          0x22) <= pbVar6->keys[uVar14])) {
                  pbVar26 = pbVar6->vals;
                  if ((iVar21 < idx->n_lvls) && (1 < (long)pbVar26[uVar14].n)) {
                    ks_introsort__off((long)pbVar26[uVar14].n,pbVar26[uVar14].list);
                  }
                  if ((pbVar26[uVar14].list[(long)pbVar26[uVar14].n + -1].v >> 0x10) -
                      ((pbVar26[uVar14].list)->u >> 0x10) < 0x10000) {
                    uVar23 = pbVar6->n_buckets;
                    if (uVar23 == 0) {
                      uVar17 = 0;
                    }
                    else {
                      uVar20 = pbVar6->keys[uVar14] - 1 >> 3;
                      uVar22 = uVar23 - 1 & uVar20;
                      iVar24 = 1;
                      uVar16 = uVar22;
                      do {
                        bVar12 = (char)uVar16 * '\x02' & 0x1e;
                        uVar13 = pbVar6->flags[uVar16 >> 4] >> bVar12;
                        if (((uVar13 & 2) != 0) ||
                           (((uVar13 & 1) == 0 && (pbVar6->keys[uVar16] == uVar20)))) {
                          uVar17 = (ulong)uVar16;
                          if ((pbVar6->flags[uVar16 >> 4] >> bVar12 & 3) != 0) {
                            uVar17 = (ulong)uVar23;
                          }
                          break;
                        }
                        uVar16 = uVar16 + iVar24 & uVar23 - 1;
                        iVar24 = iVar24 + 1;
                        uVar17 = (ulong)uVar23;
                      } while (uVar16 != uVar22);
                    }
                    if ((uint)uVar17 != uVar23) {
                      pbVar1 = pbVar6->vals + uVar17;
                      iVar24 = pbVar26[uVar14].n + pbVar1->n;
                      if (pbVar1->m < iVar24) {
                        uVar23 = iVar24 - 1;
                        uVar23 = (int)uVar23 >> 1 | uVar23;
                        uVar23 = (int)uVar23 >> 2 | uVar23;
                        uVar23 = (int)uVar23 >> 4 | uVar23;
                        uVar23 = (int)uVar23 >> 8 | uVar23;
                        uVar23 = (int)uVar23 >> 0x10 | uVar23;
                        pbVar1->m = uVar23 + 1;
                        phVar11 = (hts_pair64_t *)
                                  realloc(pbVar1->list,(long)(int)uVar23 * 0x10 + 0x10);
                        pbVar1->list = phVar11;
                      }
                      memcpy(pbVar1->list + pbVar1->n,pbVar26[uVar14].list,
                             (long)pbVar26[uVar14].n << 4);
                      pbVar1->n = pbVar1->n + pbVar26[uVar14].n;
                      free(pbVar26[uVar14].list);
                      if (pbVar6->n_buckets != kVar9) {
                        uVar23 = pbVar6->flags[uVar8];
                        if ((uVar23 & uVar25) == 0) {
                          pbVar6->flags[uVar8] = uVar23 | 1 << uVar15;
                          pbVar6->size = pbVar6->size - 1;
                        }
                      }
                    }
                  }
                }
                uVar14 = (ulong)(kVar9 + 1);
              } while (kVar9 + 1 != pbVar6->n_buckets);
            }
            bVar7 = 1 < iVar21;
            iVar21 = iVar21 + -1;
          } while (bVar7);
        }
        uVar15 = pbVar6->n_buckets;
        if (uVar15 == 0) {
          uVar14 = 0;
        }
        else {
          uVar25 = 0;
          iVar21 = 1;
          do {
            bVar12 = (char)uVar25 * '\x02' & 0x1e;
            uVar23 = pbVar6->flags[uVar25 >> 4] >> bVar12;
            if (((uVar23 & 2) != 0) || (((uVar23 & 1) == 0 && (pbVar6->keys[uVar25] == 0)))) {
              uVar14 = (ulong)uVar25;
              if ((pbVar6->flags[uVar25 >> 4] >> bVar12 & 3) != 0) {
                uVar14 = (ulong)uVar15;
              }
              break;
            }
            uVar25 = uVar25 + iVar21;
            iVar21 = iVar21 + 1;
            uVar25 = uVar25 & uVar15 - 1;
            uVar14 = (ulong)uVar15;
          } while (uVar25 != 0);
        }
        if ((uint)uVar14 != uVar15) {
          ks_introsort__off((long)pbVar6->vals[uVar14].n,pbVar6->vals[uVar14].list);
        }
        if (pbVar6->n_buckets != 0) {
          uVar15 = 0;
          do {
            if (((pbVar6->flags[uVar15 >> 4] >> ((char)uVar15 * '\x02' & 0x1fU) & 3) == 0) &&
               (pbVar6->keys[uVar15] < (uint)idx->n_bins)) {
              pbVar26 = pbVar6->vals;
              iVar21 = 1;
              if (1 < pbVar26[uVar15].n) {
                iVar21 = 0;
                lVar18 = 1;
                lVar19 = 0x10;
                do {
                  phVar11 = pbVar26[uVar15].list;
                  if (phVar11[iVar21].v >> 0x10 < *(ulong *)((long)&phVar11->u + lVar19) >> 0x10) {
                    puVar2 = (uint64_t *)((long)&phVar11->u + lVar19);
                    uVar4 = puVar2[1];
                    phVar11[(long)iVar21 + 1].u = *puVar2;
                    phVar11[(long)iVar21 + 1].v = uVar4;
                    iVar21 = iVar21 + 1;
                  }
                  else {
                    uVar14 = *(ulong *)((long)&phVar11->v + lVar19);
                    if (phVar11[iVar21].v < uVar14) {
                      phVar11[iVar21].v = uVar14;
                    }
                  }
                  lVar18 = lVar18 + 1;
                  lVar19 = lVar19 + 0x10;
                } while (lVar18 < pbVar26[uVar15].n);
                iVar21 = iVar21 + 1;
              }
              pbVar26[uVar15].n = iVar21;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != pbVar6->n_buckets);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < idx->n);
  }
  (idx->z).finished = 1;
  return;
}

Assistant:

void hts_idx_finish(hts_idx_t *idx, uint64_t final_offset)
{
    int i;
    if (idx == NULL || idx->z.finished) return; // do not run this function on an empty index or multiple times
    if (idx->z.save_tid >= 0) {
        insert_to_b(idx->bidx[idx->z.save_tid], idx->z.save_bin, idx->z.save_off, final_offset);
        insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.off_beg, final_offset);
        insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.n_mapped, idx->z.n_unmapped);
    }
    for (i = 0; i < idx->n; ++i) {
        update_loff(idx, i, (idx->fmt == HTS_FMT_CSI));
        compress_binning(idx, i);
    }
    idx->z.finished = 1;
}